

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalProgramTrigger.cpp
# Opt level: O3

void * ExternalProgramTriggerThread(void *pParam)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  CHRONO chrono;
  char logexternalprogramtriggerfilename [256];
  timespec local_198;
  timespec local_188;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  timespec local_158;
  int local_148;
  FILE *local_140;
  char local_138 [264];
  
  pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
  pcVar4 = strtimeex_fns();
  iVar8 = (int)pParam;
  sprintf(local_138,"log/logexternalprogramtrigger%d_%.64s.csv",(ulong)pParam & 0xffffffff,pcVar4);
  pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
  __stream = fopen(local_138,"w");
  if (__stream == (FILE *)0x0) {
    puts("Unable to create log file.");
  }
  else {
    fprintf(__stream,"%% Time (in s); Trigger (1 : on, 0 : off);\n");
    fflush(__stream);
    iVar2 = clock_getres(4,&local_158);
    if (iVar2 == 0) {
      iVar2 = clock_gettime(4,&local_188);
      if (iVar2 == 0) {
        local_148 = 0;
        local_178 = 0;
        uStack_170 = 0;
        local_168 = 0;
        uStack_160 = 0;
      }
    }
    local_140 = __stream;
    do {
      do {
        uVar1 = period_externalprogramtrigger[iVar8] * 1000;
        if (period_externalprogramtrigger[iVar8] < 1) {
          uVar1 = 100000;
        }
        local_198.tv_sec = (ulong)uVar1 / 1000000;
        local_198.tv_nsec = (long)((uVar1 % 1000000) * 1000);
        nanosleep(&local_198,(timespec *)0x0);
        if (bExit != 0) goto LAB_0019867c;
      } while (bExternalProgramTrigger[iVar8] == 0);
      pthread_mutex_lock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar8));
      __stream_00 = fopen(ExternalProgramTriggerFileName[iVar8],"r");
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
        bExternalProgramTriggerDetected[iVar8] = 1;
        if (local_148 == 0) {
          clock_gettime(4,&local_198);
          uVar7 = ((local_198.tv_sec + local_168) - local_188.tv_sec) +
                  (long)(local_198.tv_nsec + uStack_160) / 1000000000;
          uVar5 = (long)(local_198.tv_nsec + uStack_160) % 1000000000 - local_188.tv_nsec;
          if ((long)uVar5 < 0) {
            uVar7 = uVar7 + ~(-uVar5 / 1000000000);
            uVar5 = uVar5 + 1000000000 + (-uVar5 / 1000000000) * 1000000000;
          }
          uVar6 = (ulong)(uint)bExternalProgramTriggerDetected[iVar8];
        }
        else {
          uVar6 = 1;
          uVar7 = local_168;
          uVar5 = uStack_160;
        }
        fprintf(__stream,"%f;%d;\n",
                SUB84((double)(long)uVar5 / 1000000000.0 + (double)(long)uVar7,0),uVar6);
        fflush(__stream);
        iVar2 = procid_externalprogramtrigger[iVar8];
        if (iVar2 != -1) {
          bExternalProgramTrigger[iVar8] = 0;
          if (0 < nbretries_externalprogramtrigger[iVar8]) {
            iVar2 = 0;
            do {
              iVar3 = remove(ExternalProgramTriggerFileName[iVar8]);
              if (iVar3 == 0) break;
              local_198.tv_sec = (__time_t)(retrydelay_externalprogramtrigger[iVar8] / 1000);
              local_198.tv_nsec =
                   (long)(((retrydelay_externalprogramtrigger[iVar8] * 1000) % 1000000) * 1000);
              nanosleep(&local_198,(timespec *)0x0);
              iVar2 = iVar2 + 1;
            } while (iVar2 < nbretries_externalprogramtrigger[iVar8]);
            iVar2 = procid_externalprogramtrigger[iVar8];
            __stream = local_140;
          }
          if (bEcho != 0) {
            printf("execute %d\n");
            iVar2 = procid_externalprogramtrigger[iVar8];
          }
          ExecuteProcedure(iVar2);
          bWaiting = 0;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar8));
    } while (bExit == 0);
LAB_0019867c:
    if (local_148 == 0) {
      clock_gettime(4,&local_198);
      local_178 = local_198.tv_sec;
      uStack_170 = local_198.tv_nsec;
      local_198.tv_sec =
           ((local_198.tv_sec + local_168) - local_188.tv_sec) +
           (long)(local_198.tv_nsec + uStack_160) / 1000000000;
      local_198.tv_nsec = (long)(local_198.tv_nsec + uStack_160) % 1000000000 - local_188.tv_nsec;
      if (local_198.tv_nsec < 0) {
        local_198.tv_sec = local_198.tv_sec + ~((ulong)-local_198.tv_nsec / 1000000000);
        local_198.tv_nsec =
             local_198.tv_nsec + 1000000000U + ((ulong)-local_198.tv_nsec / 1000000000) * 1000000000
        ;
      }
      local_168 = local_198.tv_sec;
      uStack_160 = local_198.tv_nsec;
    }
    fclose(__stream);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ExternalProgramTriggerThread(void* pParam)
{
	int id = (int)(intptr_t)pParam;

	FILE* logexternalprogramtriggerfile = NULL;
	char logexternalprogramtriggerfilename[MAX_BUF_LEN];

	FILE* file = NULL;
	int i = 0;
	CHRONO chrono;

	EnterCriticalSection(&strtimeCS);
	sprintf(logexternalprogramtriggerfilename, LOG_FOLDER"logexternalprogramtrigger%d_%.64s.csv", id, strtimeex_fns());
	LeaveCriticalSection(&strtimeCS);
	logexternalprogramtriggerfile = fopen(logexternalprogramtriggerfilename, "w");
	if (logexternalprogramtriggerfile == NULL)
	{
		printf("Unable to create log file.\n");
		if (!bExit) bExit = TRUE; // Unexpected program exit...
		return 0;
	}

	fprintf(logexternalprogramtriggerfile, "%% Time (in s); Trigger (1 : on, 0 : off);\n");
	fflush(logexternalprogramtriggerfile);

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*(period_externalprogramtrigger[id] > 0? period_externalprogramtrigger[id]: 100));

		if (bExit) break;
		if (!bExternalProgramTrigger[id]) continue;

		EnterCriticalSection(&ExternalProgramTriggerCS[id]);

		file = fopen(ExternalProgramTriggerFileName[id], "r");
		if (file != NULL)
		{
			fclose(file);
			bExternalProgramTriggerDetected[id] = TRUE;
#pragma region Actions
			fprintf(logexternalprogramtriggerfile, "%f;%d;\n", GetTimeElapsedChronoQuick(&chrono), bExternalProgramTriggerDetected[id]);
			fflush(logexternalprogramtriggerfile);

			if (procid_externalprogramtrigger[id] != -1)
			{
				// disableexternalprogramtrigger to avoid multiple execute...
				bExternalProgramTrigger[id] = FALSE;
				for (i = 0; i < nbretries_externalprogramtrigger[id]; i++)
				{
					if (remove(ExternalProgramTriggerFileName[id]) == 0) break;
					uSleep(1000*retrydelay_externalprogramtrigger[id]);
				}
				if (bEcho) printf("execute %d\n", procid_externalprogramtrigger[id]);
				ExecuteProcedure(procid_externalprogramtrigger[id]);
				bWaiting = FALSE; // To interrupt and force execution of the next commands...
			}
#pragma endregion
		}

		LeaveCriticalSection(&ExternalProgramTriggerCS[id]);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	fclose(logexternalprogramtriggerfile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}